

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

int __thiscall kj::anon_unknown_9::DiskHandle::stat(DiskHandle *this,char *__file,stat *__buf)

{
  int iVar1;
  Fault f;
  stat stats;
  Fault local_b0;
  stat local_a8;
  
  do {
    iVar1 = fstat64(*(int *)__file,(stat64 *)&local_a8);
    if (-1 < iVar1) goto LAB_001d9c60;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x13d,iVar1,"::fstat(fd, &stats)","");
    kj::_::Debug::Fault::fatal(&local_b0);
  }
LAB_001d9c60:
  statToMetadata((Metadata *)this,&local_a8);
  return (int)this;
}

Assistant:

FsNode::Metadata stat() const {
    struct stat stats;
    KJ_SYSCALL(::fstat(fd, &stats));
    return statToMetadata(stats);
  }